

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.h
# Opt level: O3

string * __thiscall
TgBot::TgTypeParser::parseArray<TgBot::ShippingOption>
          (string *__return_storage_ptr__,TgTypeParser *this,
          TgTypeToJsonFunc<TgBot::ShippingOption> parseFunc,
          vector<std::shared_ptr<TgBot::ShippingOption>,_std::allocator<std::shared_ptr<TgBot::ShippingOption>_>_>
          *objects)

{
  long lVar1;
  pointer pcVar2;
  code *pcVar3;
  undefined8 uVar4;
  size_type sVar5;
  char cVar6;
  long *in_R8;
  long lVar7;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  lVar7 = *in_R8;
  lVar1 = in_R8[1];
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (lVar7 == lVar1) {
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    cVar6 = (char)__return_storage_ptr__;
    std::__cxx11::string::push_back(cVar6);
    lVar7 = *in_R8;
    lVar1 = in_R8[1];
    if (lVar7 != lVar1) {
      do {
        pcVar3 = (code *)parseFunc;
        if ((parseFunc & 1) != 0) {
          pcVar3 = *(code **)(*(long *)(this + (long)objects) + -1 + parseFunc);
        }
        (*pcVar3)(local_50,this + (long)objects,lVar7);
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50[0]);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
        std::__cxx11::string::push_back(cVar6);
        lVar7 = lVar7 + 0x10;
      } while (lVar7 != lVar1);
    }
    sVar5 = __return_storage_ptr__->_M_string_length - 1;
    if (__return_storage_ptr__->_M_string_length == 0) {
      uVar4 = std::__throw_out_of_range_fmt
                        ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                         "basic_string::erase",sVar5,0);
      pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != &__return_storage_ptr__->field_2) {
        operator_delete(pcVar2);
      }
      _Unwind_Resume(uVar4);
    }
    __return_storage_ptr__->_M_string_length = sVar5;
    (__return_storage_ptr__->_M_dataplus)._M_p[sVar5] = '\0';
    std::__cxx11::string::push_back(cVar6);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string parseArray(TgTypeToJsonFunc<T> parseFunc, const std::vector<std::shared_ptr<T>>& objects) const {
        if (objects.empty())
            return "";
        std::string result;
        result += '[';
        for (const std::shared_ptr<T>& item : objects) {
            result += (this->*parseFunc)(item);
            result += ',';
        }
        result.erase(result.length() - 1);
        result += ']';
        return result;
    }